

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O1

GrcEnv * __thiscall
GrcManager::PushTableEnv(GrcManager *this,GrpLineAndFile *lnf,string *staTableName)

{
  GrcSymbolTable *this_00;
  pointer pcVar1;
  pointer pGVar2;
  bool bVar3;
  Symbol this_01;
  GrcEnv *pGVar4;
  int iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  pair<GrcSymbolTableEntry_*,_int> hmpair;
  string local_a0;
  string local_80;
  string local_60;
  pair<GrcSymbolTableEntry_*,_int> local_40;
  
  this_00 = this->m_psymtbl;
  pcVar1 = (staTableName->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + staTableName->_M_string_length);
  this_01 = GrcSymbolTable::FindSymbol(this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((this_01 == (Symbol)0x0) ||
     (bVar3 = GrcSymbolTableEntry::FitsSymbolType(this_01,ksymtTable), !bVar3)) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Invalid table name: ","");
    pcVar1 = (staTableName->_M_dataplus)._M_p;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar1,pcVar1 + staTableName->_M_string_length);
    GrcErrorList::AddItem
              (&g_errorList,true,0x49d,(GdlObject *)0x0,lnf,&local_80,&local_a0,(string *)0x0,
               (string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pGVar4 = PushEnvAux(this);
  }
  else {
    pGVar2 = (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_40.first = pGVar2[-1].m_psymTable;
    local_40.second = pGVar2[-1].m_nPass;
    std::
    _Rb_tree<GrcSymbolTableEntry*,std::pair<GrcSymbolTableEntry*const,int>,std::_Select1st<std::pair<GrcSymbolTableEntry*const,int>>,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,int>>>
    ::_M_emplace_unique<std::pair<GrcSymbolTableEntry*,int>&>
              ((_Rb_tree<GrcSymbolTableEntry*,std::pair<GrcSymbolTableEntry*const,int>,std::_Select1st<std::pair<GrcSymbolTableEntry*const,int>>,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,int>>>
                *)&this->m_hmpsymnCurrPass,&local_40);
    pGVar4 = PushEnvAux(this);
    pGVar4->m_psymTable = this_01;
    p_Var8 = &(this->m_hmpsymnCurrPass)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = (this->m_hmpsymnCurrPass)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var8->_M_header;
    for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[*(Symbol *)(p_Var7 + 1) < this_01])
    {
      if (*(Symbol *)(p_Var7 + 1) >= this_01) {
        p_Var6 = p_Var7;
      }
    }
    p_Var7 = &p_Var8->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var8) &&
       (p_Var7 = p_Var6, this_01 < *(Symbol *)(p_Var6 + 1))) {
      p_Var7 = &p_Var8->_M_header;
    }
    if ((_Rb_tree_header *)p_Var7 == p_Var8) {
      iVar5 = 0;
    }
    else {
      iVar5 = *(int *)&p_Var7[1]._M_parent;
    }
    pGVar4->m_nPass = iVar5;
  }
  return pGVar4;
}

Assistant:

GrcEnv * GrcManager::PushTableEnv(GrpLineAndFile & lnf, std::string staTableName)
{
	Symbol psymTable = SymbolTable()->FindSymbol(staTableName);
	if (!psymTable || !psymTable->FitsSymbolType(ksymtTable))
	{
		g_errorList.AddError(1181, NULL,
			"Invalid table name: ",
			staTableName,
			lnf);
		return PushGeneralEnv(lnf);	// just push a copy of current env
	}
	else
	{
		GrcEnv * penvPrev = &(m_venv[m_venv.size() - 1]);
		Symbol psymPrevTable = penvPrev->Table();
		int nPrevPass = penvPrev->Pass();
		std::pair<Symbol, int> hmpair;
		hmpair.first = psymPrevTable;
		hmpair.second = nPrevPass;
		m_hmpsymnCurrPass.insert(hmpair);
		//m_hmpsymnCurrPass.Insert(psymPrevTable, nPrevPass, true);

		GrcEnv * penvNew = PushEnvAux();

		penvNew->SetTable(psymTable);
		int nPass = 0;
		std::map<Symbol, int>::iterator hmit = m_hmpsymnCurrPass.find(psymTable);
		if (hmit != m_hmpsymnCurrPass.end())
			nPass = hmit->second;
		//m_hmpsymnCurrPass.Retrieve(psymTable, &nPass);
		penvNew->SetPass(nPass);

		return penvNew;
	}
}